

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O2

uint8 * google::protobuf::io::CodedOutputStream::WriteVarint32FallbackToArray
                  (uint32 value,uint8 *target)

{
  byte bVar1;
  long lStack_8;
  
  *target = (byte)value | 0x80;
  if (value < 0x80) {
    *target = (byte)value;
    lStack_8 = 1;
  }
  else {
    bVar1 = (byte)(value >> 7);
    target[1] = bVar1 | 0x80;
    if (value < 0x4000) {
      target[1] = bVar1;
      lStack_8 = 2;
    }
    else {
      bVar1 = (byte)(value >> 0xe);
      target[2] = bVar1 | 0x80;
      if (value < 0x200000) {
        target[2] = bVar1;
        lStack_8 = 3;
      }
      else {
        bVar1 = (byte)(value >> 0x15);
        target[3] = bVar1 | 0x80;
        if (value < 0x10000000) {
          target[3] = bVar1;
          lStack_8 = 4;
        }
        else {
          target[4] = (byte)(value >> 0x1c);
          lStack_8 = 5;
        }
      }
    }
  }
  return target + lStack_8;
}

Assistant:

uint8* CodedOutputStream::WriteVarint32FallbackToArray(
    uint32 value, uint8* target) {
  return WriteVarint32FallbackToArrayInline(value, target);
}